

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

size_t __thiscall
libchars::edit_object::render(edit_object *this,size_t buf_idx,size_t limit,string *sequence)

{
  size_t sVar1;
  string *sequence_local;
  size_t limit_local;
  size_t buf_idx_local;
  edit_object *this_local;
  
  if ((limit == 0) || (this->buflen <= buf_idx)) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::assign((char *)sequence,(ulong)this->buffer);
  }
  sVar1 = std::__cxx11::string::length();
  return sVar1;
}

Assistant:

virtual size_t render(size_t buf_idx, size_t limit, std::string &sequence)
        {
            //NOTE: return number of *displayed* characters, which might
            // be different from sequence.length() (e.g. if color used)
            if (limit > 0 && buf_idx < buflen) 
                sequence.assign(buffer, buflen-buf_idx);
            else 
                sequence.clear();
            return sequence.length();
        }